

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O0

void verror_at(C_Parser *tokenizer,char *filename,char *input,int line_no,char *loc,char *fmt,
              __va_list_tag *ap)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int pos;
  int indent;
  char *end;
  char *line;
  char *fmt_local;
  char *loc_local;
  int line_no_local;
  char *input_local;
  char *filename_local;
  C_Parser *tokenizer_local;
  
  end = loc;
  while( true ) {
    bVar3 = false;
    if (input < end) {
      bVar3 = end[-1] != '\n';
    }
    _pos = loc;
    if (!bVar3) break;
    end = end + -1;
  }
  while( true ) {
    bVar3 = false;
    if (*_pos != '\0') {
      bVar3 = *_pos != '\n';
    }
    if (!bVar3) break;
    _pos = _pos + 1;
  }
  iVar1 = error_sprintf(tokenizer,"%s:%d: ",filename,(ulong)(uint)line_no);
  error_sprintf(tokenizer,"%.*s\n",(ulong)(uint)((int)_pos - (int)end),end);
  iVar2 = C_display_width(tokenizer,end,(int)loc - (int)end);
  error_sprintf(tokenizer,"%*s",(ulong)(uint)(iVar2 + iVar1),"");
  error_sprintf(tokenizer,"^ ");
  error_vsprintf(tokenizer,fmt,ap);
  error_sprintf(tokenizer,"\n");
  return;
}

Assistant:

static void verror_at(C_Parser *tokenizer, char *filename, char *input, int line_no,
                      char *loc, char *fmt, va_list ap) {
  // Find a line containing `loc`.
  char *line = loc;
  while (input < line && line[-1] != '\n')
    line--;

  char *end = loc;
  while (*end && *end != '\n')
    end++;

  // Print out the line.
  int indent = error_sprintf(tokenizer, "%s:%d: ", filename, line_no);
  error_sprintf(tokenizer, "%.*s\n", (int)(end - line), line);

  // Show the error message.
  int pos = C_display_width(tokenizer, line, loc - line) + indent;

  error_sprintf(tokenizer, "%*s", pos, ""); // print pos spaces.
  error_sprintf(tokenizer, "^ ");
  error_vsprintf(tokenizer, fmt, ap);
  error_sprintf(tokenizer, "\n");
}